

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,double *value)

{
  bool bVar1;
  ostream *poVar2;
  char cVar3;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string value_str;
  double v;
  undefined1 local_208 [32];
  bool local_1e8;
  string local_1e0;
  string local_1c0;
  double local_1a0 [14];
  ios_base local_130 [264];
  
  bVar1 = MaybeNonFinite<double>(this,local_1a0);
  if (bVar1) {
    *value = local_1a0[0];
    cVar3 = '\x01';
  }
  else {
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    bVar1 = LexFloat(this,&local_1e0);
    if (bVar1) {
      anon_unknown_3::ParseDouble
                ((expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_208,&local_1e0);
      cVar3 = local_1e8;
      if (local_1e8 == false) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                   ,0x5f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"ReadBasicType",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
        poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a0,0xb38);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Failed to parse floating value.",0x1f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        ::std::ios_base::~ios_base(local_130);
      }
      else {
        *value = (double)local_208._0_8_;
      }
      if ((local_1e8 == false) && ((undefined1 *)local_208._0_8_ != local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                 ,0x5f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"ReadBasicType",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a0,0xb33);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Failed to lex floating value literal.",0x25);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_208);
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      ::std::ios_base::~ios_base(local_130);
      cVar3 = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                               local_1e0.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)cVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(double *value) {
  // -inf, inf, nan
  {
    double v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseDouble(value_str);
  if (!flt) {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  } else {
    (*value) = flt.value();
  }

  return true;
}